

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O1

void __thiscall Clasp::Cli::Output::stopStep(Output *this,Summary *s)

{
  FacadePtr pCVar1;
  int iVar2;
  Model *pMVar3;
  undefined4 extraout_var;
  Model m;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  ulong local_28;
  
  pMVar3 = ClaspFacade::Summary::model(s);
  if ((pMVar3 == (Model *)0x0) || (this->last_ != true)) {
    if (this->quiet_[0] == '\0') {
      pMVar3 = ClaspFacade::Summary::model(s);
      if (pMVar3 != (Model *)0x0) {
        pMVar3 = ClaspFacade::Summary::model(s);
        if ((pMVar3->field_0x23 & 0x20) != 0) {
          pMVar3 = ClaspFacade::Summary::model(s);
          if ((pMVar3->field_0x23 & 8) == 0) {
            pCVar1 = s->facade;
            pMVar3 = ClaspFacade::Summary::model(s);
            (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[8])
                      (this,&(pCVar1->ctx).output,pMVar3,0);
          }
        }
      }
    }
  }
  else {
    pMVar3 = ClaspFacade::Summary::model(s);
    local_48 = (undefined4)pMVar3->num;
    uStack_44 = *(undefined4 *)((long)&pMVar3->num + 4);
    uStack_40 = *(undefined4 *)&pMVar3->ctx;
    uStack_3c = *(undefined4 *)((long)&pMVar3->ctx + 4);
    local_38 = *(undefined4 *)&pMVar3->values;
    uStack_34 = *(undefined4 *)((long)&pMVar3->values + 4);
    uStack_30 = *(undefined4 *)&pMVar3->costs;
    uStack_2c = *(undefined4 *)((long)&pMVar3->costs + 4);
    local_28 = *(ulong *)&pMVar3->field_0x20 & 0xffffffffdfffffff;
    (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[8])
              (this,&(s->facade->ctx).output,&local_48,1);
  }
  if (this->quiet_[2] == '\x01') {
    this->summary_ = s;
  }
  else if (this->quiet_[2] == '\0') {
    (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[0xc])(this,s,0);
    iVar2 = (*(s->facade->config_->super_BasicSatConfig).super_UserConfiguration.super_Configuration
              ._vptr_Configuration[3])();
    if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 8) & 0x18) != 0) {
      (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[0xd])(this,s,0);
    }
  }
  return;
}

Assistant:

void Output::stopStep(const ClaspFacade::Summary& s){
	if (s.model() && last_) {
		Model m = *s.model();
		m.up = 0; // ignore update state and always print as model
		printModel(s.ctx().output, m, print_best);
	}
	else if (modelQ() == print_all && s.model() && s.model()->up && !s.model()->def) {
		printModel(s.ctx().output, *s.model(), print_all);
	}
	if (callQ() == print_all) {
		printSummary(s, false);
		if (stats(s)) { printStatistics(s, false); }
	}
	else if (callQ() == print_best) {
		summary_ = &s;
	}
}